

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<bool>::insert
          (QPodArrayOps<bool> *this,qsizetype i,qsizetype n,parameter_type t)

{
  byte bVar1;
  bool *pbVar2;
  byte in_CL;
  long in_RDX;
  QArrayDataPointer<bool> *in_RSI;
  QArrayDataPointer<bool> *in_RDI;
  bool *where;
  GrowthPosition pos;
  bool copy;
  bool **in_stack_ffffffffffffffd8;
  undefined4 uVar3;
  undefined2 in_stack_ffffffffffffffe4;
  byte bVar4;
  
  bVar1 = in_CL & 1;
  uVar3 = 0;
  if ((in_RDI->size != 0) && (in_RSI == (QArrayDataPointer<bool> *)0x0)) {
    uVar3 = 1;
  }
  bVar4 = bVar1;
  QArrayDataPointer<bool>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
             CONCAT17(in_CL,CONCAT16(in_CL,CONCAT24(in_stack_ffffffffffffffe4,uVar3))) &
             0x101ffffffffffff,in_stack_ffffffffffffffd8,in_RDI);
  pbVar2 = createHole((QPodArrayOps<bool> *)in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
                      CONCAT17(bVar4,CONCAT16(bVar1,CONCAT24(in_stack_ffffffffffffffe4,uVar3))),
                      (qsizetype)in_stack_ffffffffffffffd8);
  while (in_RDX != 0) {
    *pbVar2 = (bool)(bVar1 & 1);
    pbVar2 = pbVar2 + 1;
    in_RDX = in_RDX + -1;
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        typename Data::GrowthPosition pos = Data::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = Data::GrowsAtBeginning;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        T *where = createHole(pos, i, n);
        while (n--)
            *where++ = copy;
    }